

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::PopFont(void)

{
  ImVector<ImFont_*> *this;
  ImGuiContext *pIVar1;
  ImFont **ppIVar2;
  ImFont *font;
  
  pIVar1 = GImGui;
  ImDrawList::PopTextureID(GImGui->CurrentWindow->DrawList);
  this = &pIVar1->FontStack;
  ImVector<ImFont_*>::pop_back(this);
  if ((pIVar1->FontStack).Size == 0) {
    font = GetDefaultFont();
  }
  else {
    ppIVar2 = ImVector<ImFont_*>::back(this);
    font = *ppIVar2;
  }
  SetCurrentFont(font);
  return;
}

Assistant:

void  ImGui::PopFont()
{
    ImGuiContext& g = *GImGui;
    g.CurrentWindow->DrawList->PopTextureID();
    g.FontStack.pop_back();
    SetCurrentFont(g.FontStack.empty() ? GetDefaultFont() : g.FontStack.back());
}